

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code-generator.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool softAes;
  bool genNative;
  bool genAsm;
  int nonce;
  bool genSuperscalar;
  Blake2Generator gen;
  AssemblyGeneratorX86 asmX86;
  SuperscalarProgram p;
  bool local_127b;
  bool local_127a;
  bool local_1279;
  uint32_t local_1278;
  bool local_1271;
  Blake2Generator local_1270;
  undefined1 local_1228 [424];
  SuperscalarProgram local_1080;
  
  readOption("--softAes",argc,argv,&local_127b);
  readOption("--genAsm",argc,argv,&local_1279);
  readIntOption("--nonce",argc,argv,(int *)&local_1278,1000);
  readOption("--genNative",argc,argv,&local_127a);
  readOption("--genSuperscalar",argc,argv,&local_1271);
  if (local_1271 == true) {
    defyx::Blake2Generator::Blake2Generator(&local_1270,seed,(long)(int)local_1278,0);
    defyx::generateSuperscalar(&local_1080,&local_1270);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1228);
    defyx::AssemblyGeneratorX86::generateAsm((AssemblyGeneratorX86 *)local_1228,&local_1080);
    std::ostream::operator<<(&std::cout,(streambuf *)(local_1228 + 0x18));
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1228);
  }
  else if (local_1279 == true) {
    if (local_127b == true) {
      generateAsm<true>(local_1278);
    }
    else {
      generateAsm<false>(local_1278);
    }
  }
  else if (local_127a == true) {
    if (local_127b == true) {
      generateNative<true>(local_1278);
    }
    else {
      generateNative<false>(local_1278);
    }
  }
  else {
    printUsage(*argv);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	bool softAes, genAsm, genNative, genSuperscalar;
	int nonce;

	readOption("--softAes", argc, argv, softAes);
	readOption("--genAsm", argc, argv, genAsm);
	readIntOption("--nonce", argc, argv, nonce, 1000);
	readOption("--genNative", argc, argv, genNative);
	readOption("--genSuperscalar", argc, argv, genSuperscalar);

	if (genSuperscalar) {
		defyx::SuperscalarProgram p;
		defyx::Blake2Generator gen(seed, nonce);
		defyx::generateSuperscalar(p, gen);
		defyx::AssemblyGeneratorX86 asmX86;
		asmX86.generateAsm(p);
		asmX86.printCode(std::cout);
		return 0;
	}

	if (genAsm) {
		if (softAes)
			generateAsm<true>(nonce);
		else
			generateAsm<false>(nonce);
		return 0;
	}

	if (genNative) {
		if (softAes)
			generateNative<true>(nonce);
		else
			generateNative<false>(nonce);
		return 0;
	}

	printUsage(argv[0]);
	return 0;
}